

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint8_t * cfd::core::ConfidentialTransaction::CopyConfidentialCommitment
                    (void *buffer,size_t buffer_size,size_t explicit_size,uint8_t *address)

{
  undefined1 local_78 [8];
  uint8_t ct_buffer [33];
  size_t local_48;
  size_t copy_size;
  size_t max_size;
  uint8_t *buffer_addr;
  uint8_t *result;
  uint8_t *address_local;
  size_t explicit_size_local;
  size_t buffer_size_local;
  void *buffer_local;
  
  if (((buffer == (void *)0x0) || (buffer_size == 0)) || (*buffer == '\0')) {
    *address = '\0';
    buffer_addr = address + 1;
  }
  else {
    copy_size = 0x21;
    if (*buffer == '\x01') {
      copy_size = explicit_size;
    }
    local_48 = copy_size;
    if (buffer_size <= copy_size) {
      local_48 = buffer_size;
    }
    memset(local_78,0,0x21);
    memcpy(local_78,buffer,local_48);
    memcpy(address,local_78,copy_size);
    buffer_addr = address + copy_size;
  }
  return buffer_addr;
}

Assistant:

uint8_t *ConfidentialTransaction::CopyConfidentialCommitment(
    const void *buffer, size_t buffer_size, size_t explicit_size,
    uint8_t *address) {
  uint8_t *result = address;
  const uint8_t *buffer_addr = static_cast<const uint8_t *>(buffer);
  if ((!buffer_addr) || (buffer_size == 0) || (buffer_addr[0] == 0)) {
    *result = 0;  // version is 0
    ++result;
  } else {
    size_t max_size = kConfidentialDataSize;
    if (buffer_addr[0] == kConfidentialVersion_1) {
      max_size = explicit_size;
    }
    size_t copy_size = max_size;
    if (buffer_size <= copy_size) {
      copy_size = buffer_size;
    }
    // explicit value
    // confidential value
    uint8_t ct_buffer[kConfidentialDataSize];
    memset(ct_buffer, 0, sizeof(ct_buffer));
    memcpy(ct_buffer, buffer_addr, copy_size);
    memcpy(address, ct_buffer, max_size);
    result += max_size;
  }
  return result;
}